

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMPCG.cpp
# Opt level: O2

void __thiscall phaeton::OMPCG::visitDivExpr(OMPCG *this,DivExpr *E)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"/",&local_39);
  visitBinOpExpr(this,&E->super_ExpressionNode,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void OMPCG::visitDivExpr(const DivExpr *E) { visitBinOpExpr(E, "/"); }